

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O2

QLayoutItem * __thiscall QGridLayout::itemAtPosition(QGridLayout *this,int row,int column)

{
  long lVar1;
  undefined8 *puVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  
  lVar1 = *(long *)&(this->super_QLayout).field_0x8;
  uVar3 = (ulong)*(uint *)(lVar1 + 0x160);
  if ((int)*(uint *)(lVar1 + 0x160) < 1) {
    uVar3 = 0;
  }
  uVar4 = 0;
  do {
    if (uVar3 == uVar4) {
      return (QLayoutItem *)0x0;
    }
    puVar2 = *(undefined8 **)(*(long *)(lVar1 + 0x158) + uVar4 * 8);
    if (*(int *)(puVar2 + 1) <= row) {
      iVar5 = *(int *)(lVar1 + 0xb0) + -1;
      if (-1 < *(int *)(puVar2 + 2)) {
        iVar5 = *(int *)(puVar2 + 2);
      }
      if ((row <= iVar5) && (*(int *)((long)puVar2 + 0xc) <= column)) {
        iVar5 = *(int *)(lVar1 + 0xb4) + -1;
        if (-1 < *(int *)((long)puVar2 + 0x14)) {
          iVar5 = *(int *)((long)puVar2 + 0x14);
        }
        if (column <= iVar5) {
          return (QLayoutItem *)*puVar2;
        }
      }
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

T *get() const noexcept
    {
        return d;
    }